

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_common.cpp
# Opt level: O0

void src_DestinationOut(uint32_t *dest,int length,uint32_t *src,uint32_t alpha)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint32_t sia;
  int i_1;
  uint32_t cia;
  int i;
  undefined4 local_28;
  undefined4 local_20;
  
  if (in_ECX == 0xff) {
    for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
      uVar4 = *(uint *)(in_RDI + (long)local_20 * 4);
      iVar2 = vAlpha(*(uint *)(in_RDX + (long)local_20 * 4) ^ 0xffffffff);
      uVar1 = *(uint *)(in_RDI + (long)local_20 * 4);
      iVar3 = vAlpha(*(uint *)(in_RDX + (long)local_20 * 4) ^ 0xffffffff);
      *(uint *)(in_RDI + (long)local_20 * 4) =
           ((uVar4 >> 8 & 0xff00ff) * iVar2 & 0xff00ff00) +
           ((uVar1 & 0xff00ff) * iVar3 >> 8 & 0xff00ff);
    }
  }
  else {
    for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
      iVar2 = vAlpha(*(uint *)(in_RDX + (long)local_28 * 4) ^ 0xffffffff);
      uVar4 = vAlpha(*(uint *)(in_RDX + (long)local_28 * 4) ^ 0xffffffff);
      iVar2 = ((iVar2 >> 8 & 0xff00ffU) * in_ECX & 0xff00ff00) +
              ((uVar4 & 0xff00ff) * in_ECX >> 8 & 0xff00ff) + (0xff - in_ECX);
      *(uint *)(in_RDI + (long)local_28 * 4) =
           ((*(uint *)(in_RDI + (long)local_28 * 4) >> 8 & 0xff00ff) * iVar2 & 0xff00ff00) +
           ((*(uint *)(in_RDI + (long)local_28 * 4) & 0xff00ff) * iVar2 >> 8 & 0xff00ff);
    }
  }
  return;
}

Assistant:

static void src_DestinationOut(uint32_t *dest, int length, const uint32_t *src,
                               uint32_t alpha)
{
    if (alpha == 255) {
        for (int i = 0; i < length; ++i) {
            dest[i] = BYTE_MUL(dest[i], vAlpha(~src[i]));
        }
    } else {
        uint32_t cia = 255 - alpha;
        for (int i = 0; i < length; ++i) {
            uint32_t sia = BYTE_MUL(vAlpha(~src[i]), alpha) + cia;
            dest[i] = BYTE_MUL(dest[i], sia);
        }
    }
}